

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flag.cc
# Opt level: O3

void __thiscall
absl::lts_20240722::flags_internal::FlagImpl::SetCallback
          (FlagImpl *this,FlagCallbackFunc mutation_callback)

{
  FlagCallback *pFVar1;
  
  DataGuard(this);
  absl::lts_20240722::Mutex::Lock();
  pFVar1 = this->callback_;
  if (pFVar1 == (FlagCallback *)0x0) {
    pFVar1 = (FlagCallback *)operator_new(0x10);
    (pFVar1->guard).mu_.super___atomic_base<long>._M_i = 0;
    this->callback_ = pFVar1;
  }
  pFVar1->func = mutation_callback;
  InvokeCallback(this);
  absl::lts_20240722::Mutex::Unlock();
  return;
}

Assistant:

void FlagImpl::SetCallback(const FlagCallbackFunc mutation_callback) {
  absl::MutexLock l(DataGuard());

  if (callback_ == nullptr) {
    callback_ = new FlagCallback;
  }
  callback_->func = mutation_callback;

  InvokeCallback();
}